

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O3

string * __thiscall
duckdb::CastExceptionText<duckdb::string_t,short>
          (string *__return_storage_ptr__,duckdb *this,string_t input)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  string *extraout_RAX;
  string *psVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  string_t sVar9;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string *local_38 [4];
  
  sVar9.value.pointer.ptr = (char *)this;
  sVar9.value._0_8_ = local_38;
  duckdb::ConvertToString::Operation<duckdb::string_t>(sVar9);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x4d98b8);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_48 = *plVar6;
    lStack_40 = plVar3[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar6;
    local_58 = (long *)*plVar3;
  }
  local_50 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_88 = *puVar7;
    lStack_80 = plVar3[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar7;
    local_98 = (ulong *)*plVar3;
  }
  local_90 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  duckdb::TypeIdToString_abi_cxx11_((PhysicalType)&local_78);
  uVar8 = 0xf;
  if (local_98 != &local_88) {
    uVar8 = local_88;
  }
  if (uVar8 < (ulong)(local_70 + local_90)) {
    uVar8 = 0xf;
    if (local_78 != local_68) {
      uVar8 = local_68[0];
    }
    if ((ulong)(local_70 + local_90) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_98);
      goto LAB_003e8cc0;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78);
LAB_003e8cc0:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  psVar5 = (string *)(local_38 + 2);
  if (local_38[0] != psVar5) {
    operator_delete(local_38[0]);
    psVar5 = extraout_RAX;
  }
  return psVar5;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}